

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerMSL::to_initializer_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRVariable *var)

{
  uint uVar1;
  Variant *pVVar2;
  pointer pcVar3;
  SPIRType *pSVar4;
  SPIRConstant *c;
  SPIRType *pSVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_70;
  string local_50;
  
  pSVar4 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr +
                      *(uint *)&(var->super_IVariant).field_0xc);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar1 = (var->initializer).id;
  pVVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.
           ptr;
  if ((pVVar2[uVar1].type == TypeConstant) &&
     (((pSVar4->array).super_VectorView<unsigned_int>.buffer_size != 0 ||
      (pSVar4->basetype == Struct)))) {
    c = Variant::get<spirv_cross::SPIRConstant>(pVVar2 + uVar1);
    CompilerGLSL::constant_expression_abi_cxx11_(&local_70,&this->super_CompilerGLSL,c,false,false);
  }
  else {
    CompilerGLSL::to_initializer_expression_abi_cxx11_(&local_70,&this->super_CompilerGLSL,var);
  }
  ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pSVar5 = Compiler::expression_type((Compiler *)this,(var->initializer).id);
  if ((((pSVar4->array).super_VectorView<unsigned_int>.buffer_size == 0) &&
      (pSVar4->basetype != Struct)) && (pSVar4->vecsize < pSVar5->vecsize)) {
    CompilerGLSL::vector_swizzle(pSVar4->vecsize,0);
    pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar3,pcVar3 + __return_storage_ptr__->_M_string_length);
    ::std::__cxx11::string::append((char *)&local_50);
    CompilerGLSL::enclose_expression(&local_70,&this->super_CompilerGLSL,&local_50);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::to_initializer_expression(const SPIRVariable &var)
{
	// We risk getting an array initializer here with MSL. If we have an array.
	// FIXME: We cannot handle non-constant arrays being initialized.
	// We will need to inject spvArrayCopy here somehow ...
	auto &type = get<SPIRType>(var.basetype);
	string expr;
	if (ir.ids[var.initializer].get_type() == TypeConstant &&
	    (!type.array.empty() || type.basetype == SPIRType::Struct))
		expr = constant_expression(get<SPIRConstant>(var.initializer));
	else
		expr = CompilerGLSL::to_initializer_expression(var);
	// If the initializer has more vector components than the variable, add a swizzle.
	// FIXME: This can't handle arrays or structs.
	auto &init_type = expression_type(var.initializer);
	if (type.array.empty() && type.basetype != SPIRType::Struct && init_type.vecsize > type.vecsize)
		expr = enclose_expression(expr + vector_swizzle(type.vecsize, 0));
	return expr;
}